

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

void __thiscall GB::ld_mnn_sp(GB *this)

{
  u8 uVar1;
  GB *this_local;
  
  switch((this->s).op_tick) {
  case 0xe:
    uVar1 = read_n(this);
    (this->s).field_6.field_0.z = uVar1;
    break;
  case 0x16:
    uVar1 = read_n(this);
    (this->s).field_6.field_0.w = uVar1;
    break;
  case 0x1e:
    Write(this,(this->s).field_6.wz + 1,(u8)((this->s).sp >> 8));
    break;
  case 0x26:
    Write(this,(this->s).field_6.wz,(u8)(this->s).sp);
    op_done(this);
  }
  return;
}

Assistant:

void GB::ld_mnn_sp() {
  switch (s.op_tick) {
    case 14: s.z = read_n(); break;
    case 22: s.w = read_n(); break;
    case 30: Write(s.wz + 1, s.sp >> 8); break;
    case 38: Write(s.wz, s.sp); op_done(); break;
  }
}